

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::ReaderMgr::skippedSpace(ReaderMgr *this)

{
  bool bVar1;
  ReaderMgr *this_local;
  
  do {
    bVar1 = XMLReader::skippedSpace(this->fCurReader);
    if (bVar1) {
      return true;
    }
    bVar1 = XMLReader::getNoMoreFlag(this->fCurReader);
  } while ((bVar1) && (bVar1 = popReader(this), bVar1));
  return false;
}

Assistant:

bool ReaderMgr::skippedSpace()
{
    while (true)
    {
        // If we get it, then just return true now
        if (fCurReader->skippedSpace())
            return true;

        //
        //  Check to see if we hit end of input on this reader. If so, then
        //  lets pop and try again. Else, we failed. If we cannot pop another
        //  then we failed.
        //
        if (!fCurReader->getNoMoreFlag())
            break;

        if (!popReader())
            break;
    }
    return false;
}